

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void update_timer(void)

{
  MISCSTATS *pMVar1;
  timeval timev;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  pMVar1 = MiscStats;
  MiscStats->secondsclock = (int)local_18.tv_sec + 0x81c94b00U;
  pMVar1->secondstmp = (int)local_18.tv_sec + 0x81c94b00U;
  return;
}

Assistant:

void update_timer(void) {
#ifdef DOS
  MiscStats->secondstmp = MiscStats->secondsclock = time(0) + UNIX_ALTO_TIME_DIFF;
#else
  struct timeval timev;
  gettimeofday(&timev, NIL);
  MiscStats->secondstmp = MiscStats->secondsclock = (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#endif /* DOS */
}